

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O0

void decode_alTraceSourceLabel(void)

{
  uint32 from;
  char *__s;
  char *local_250;
  char *dup;
  ALchar *str;
  undefined1 local_230 [4];
  ALuint name;
  CallerInfo callerinfo;
  
  IO_ENTRYINFO((CallerInfo *)local_230);
  if (io_failure == 0) {
    from = IO_UINT32();
    __s = IO_STRING();
    if (from != 0) {
      if (__s == (char *)0x0) {
        local_250 = (char *)0x0;
      }
      else {
        local_250 = strdup(__s);
      }
      if ((local_250 != (char *)0x0) || (__s == (char *)0x0)) {
        add_sourcelabel_to_map(from,local_250);
      }
    }
    if (io_failure == 0) {
      visit_alTraceSourceLabel((CallerInfo *)local_230,from,__s);
    }
  }
  return;
}

Assistant:

static void decode_alTraceSourceLabel(void)
{
    IO_START(alTraceSourceLabel);
    const ALuint name = IO_UINT32();
    const ALchar *str = IO_STRING();
    if (name) {
        char *dup = str ? strdup(str) : NULL;
        if (dup || !str) {
            add_sourcelabel_to_map(name, dup);
        }
    }
    if (!io_failure) visit_alTraceSourceLabel(&callerinfo, name, str);
    IO_END();
}